

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  int iVar1;
  int iVar2;
  sqlite3 *psVar3;
  bool bVar4;
  int iVar5;
  Parse *pParse_00;
  Parse *in_RSI;
  Parse *in_RDI;
  Expr *pParent;
  Expr *pNew;
  Expr *pDup;
  Expr *pE;
  int iCol;
  ExprList_item *pItem;
  int moreToDo;
  sqlite3 *db;
  ExprList *pEList;
  ExprList *pOrderBy;
  int i;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar6;
  sqlite3 *in_stack_ffffffffffffff90;
  Expr *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  int local_4c;
  anon_union_8_2_443a03b8_for_u *local_48;
  Expr *pE_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar7;
  int local_4;
  
  bVar4 = true;
  pE_00 = *(Expr **)&in_RSI->nLabel;
  if (pE_00 == (Expr *)0x0) {
    local_4 = 0;
  }
  else {
    psVar3 = in_RDI->db;
    iVar7._0_1_ = pE_00->op;
    iVar7._1_1_ = pE_00->affinity;
    iVar7._2_2_ = *(undefined2 *)&pE_00->field_0x2;
    if (psVar3->aLimit[2] < iVar7) {
      sqlite3ErrorMsg(in_RDI,"too many terms in ORDER BY clause");
      local_4 = 1;
    }
    else {
      for (iVar7 = 0; iVar5._0_1_ = pE_00->op, iVar5._1_1_ = pE_00->affinity,
          iVar5._2_2_ = *(undefined2 *)&pE_00->field_0x2, iVar7 < iVar5; iVar7 = iVar7 + 1) {
        *(byte *)((long)&pE_00->x + (long)iVar7 * 0x20 + 1) =
             *(byte *)((long)&pE_00->x + (long)iVar7 * 0x20 + 1) & 0xfe;
      }
      in_RSI->pConstExpr = (ExprList *)0x0;
      for (; in_RSI->aLabel != (int *)0x0; in_RSI = (Parse *)in_RSI->aLabel) {
        *(Parse **)(in_RSI->aLabel + 0x16) = in_RSI;
      }
      for (; uVar6 = in_RSI != (Parse *)0x0 && bVar4, in_RSI != (Parse *)0x0 && bVar4;
          in_RSI = (Parse *)in_RSI->pConstExpr) {
        bVar4 = false;
        local_48 = &pE_00->u;
        for (iVar7 = 0; iVar1._0_1_ = pE_00->op, iVar1._1_1_ = pE_00->affinity,
            iVar1._2_2_ = *(undefined2 *)&pE_00->field_0x2, iVar7 < iVar1; iVar7 = iVar7 + 1) {
          if ((*(byte *)((long)local_48 + 0x19) & 1) == 0) {
            pParse_00 = (Parse *)sqlite3ExprSkipCollate((Expr *)local_48->zToken);
            iVar5 = sqlite3ExprIsInteger(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90)
            ;
            if (iVar5 != 0) {
              resolveOutOfRangeError
                        ((Parse *)in_stack_ffffffffffffff90,
                         (char *)CONCAT17(uVar6,in_stack_ffffffffffffff88),0,0x1aaf45);
              return 1;
            }
            local_4c = resolveAsName(pParse_00,(ExprList *)in_stack_ffffffffffffffa0,
                                     in_stack_ffffffffffffff98);
            if (local_4c == 0) {
              in_stack_ffffffffffffffa0 =
                   (sqlite3 *)
                   sqlite3ExprDup(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                  (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
              if (psVar3->mallocFailed == '\0') {
                local_4c = resolveOrderByTermToExprList
                                     (in_RSI,(Select *)CONCAT44(iVar7,in_stack_ffffffffffffffe0),
                                      pE_00);
              }
              sqlite3ExprDelete(in_stack_ffffffffffffff90,
                                (Expr *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
            }
            if (local_4c < 1) {
              bVar4 = true;
            }
            else {
              in_stack_ffffffffffffff98 =
                   sqlite3Expr(in_stack_ffffffffffffffa0,
                               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                               (char *)in_stack_ffffffffffffff90);
              if (in_stack_ffffffffffffff98 == (Expr *)0x0) {
                return 1;
              }
              in_stack_ffffffffffffff98->flags = in_stack_ffffffffffffff98->flags | 0x400;
              (in_stack_ffffffffffffff98->u).iValue = local_4c;
              if ((Parse *)local_48->zToken == pParse_00) {
                local_48->zToken = (char *)in_stack_ffffffffffffff98;
              }
              else {
                in_stack_ffffffffffffff90 = (sqlite3 *)local_48->zToken;
                while (*(char *)&in_stack_ffffffffffffff90->pDfltColl->zName == 'f') {
                  in_stack_ffffffffffffff90 = (sqlite3 *)in_stack_ffffffffffffff90->pDfltColl;
                }
                in_stack_ffffffffffffff90->pDfltColl = (CollSeq *)in_stack_ffffffffffffff98;
              }
              sqlite3ExprDelete(in_stack_ffffffffffffff90,
                                (Expr *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
              *(short *)((long)local_48 + 0x1c) = (short)local_4c;
              *(byte *)((long)local_48 + 0x19) = *(byte *)((long)local_48 + 0x19) & 0xfe | 1;
            }
          }
          local_48 = local_48 + 4;
        }
      }
      for (iVar7 = 0; iVar2._0_1_ = pE_00->op, iVar2._1_1_ = pE_00->affinity,
          iVar2._2_2_ = *(undefined2 *)&pE_00->field_0x2, iVar7 < iVar2; iVar7 = iVar7 + 1) {
        if ((*(byte *)((long)&pE_00->x + (long)iVar7 * 0x20 + 1) & 1) == 0) {
          sqlite3ErrorMsg(in_RDI,"%r ORDER BY term does not match any column in the result set",
                          (ulong)(iVar7 + 1));
          return 1;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          Expr *pParent = pItem->pExpr;
          assert( pParent->op==TK_COLLATE );
          while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
          assert( pParent->pLeft==pE );
          pParent->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->u.x.iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}